

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GenerateTargetInstallRules
          (cmLocalGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurationTypes)

{
  cmGeneratorTarget *pcVar1;
  cmListFileBacktrace backtrace;
  cmListFileBacktrace backtrace_00;
  TargetType TVar2;
  cmValue cVar3;
  string *psVar4;
  pointer puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe00;
  string destination;
  undefined1 local_1b8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1a0 [2];
  pointer local_190;
  string local_188;
  string local_168;
  cmInstallScriptGenerator g;
  
  puVar5 = (this->GeneratorTargets).
           super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_190 = (this->GeneratorTargets).
              super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == local_190) {
      return;
    }
    TVar2 = cmGeneratorTarget::GetType
                      ((puVar5->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
    if (TVar2 != INTERFACE_LIBRARY) {
      pcVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
               super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&g,"PRE_INSTALL_SCRIPT",(allocator<char> *)&destination);
      cVar3 = cmGeneratorTarget::GetProperty(pcVar1,(string *)&g);
      std::__cxx11::string::~string((string *)&g);
      if (cVar3.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&local_188,(string *)cVar3.Value);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&destination,"",(allocator<char> *)&stack0xfffffffffffffe07);
        local_1b8._16_8_ = 0;
        a_Stack_1a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_1b8 + 0x10));
        backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = in_stack_fffffffffffffe00._M_pi;
        backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)(local_1b8 + 0x10);
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  (&g,&local_188,false,&destination,false,false,backtrace);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1a0);
        std::__cxx11::string::~string((string *)&destination);
        std::__cxx11::string::~string((string *)&local_188);
        cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator(&g);
      }
      psVar4 = cmTarget::GetInstallPath_abi_cxx11_
                         (((puVar5->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->Target)
      ;
      if (psVar4->_M_string_length != 0) {
        psVar4 = cmTarget::GetInstallPath_abi_cxx11_
                           (((puVar5->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl)->
                            Target);
        std::__cxx11::string::substr((ulong)&destination,(ulong)psVar4);
        cmsys::SystemTools::ConvertToUnixSlashes(&destination);
        if (destination._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&destination);
        }
        TVar2 = cmGeneratorTarget::GetType
                          ((puVar5->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar2 < SHARED_LIBRARY) {
LAB_00229b97:
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((puVar5->_M_t).
                              super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                              .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                    ((cmInstallTargetGeneratorLocal *)&g,this,psVar4,&destination,false);
          cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
LAB_00229c03:
          cmInstallTargetGenerator::~cmInstallTargetGenerator((cmInstallTargetGenerator *)&g);
        }
        else {
          if (TVar2 == SHARED_LIBRARY) {
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((puVar5->_M_t).
                                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
                      ((cmInstallTargetGeneratorLocal *)&g,this,psVar4,&destination,false);
            cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
            goto LAB_00229c03;
          }
          if (TVar2 == MODULE_LIBRARY) goto LAB_00229b97;
        }
        std::__cxx11::string::~string((string *)&destination);
      }
      pcVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>.
               super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&g,"POST_INSTALL_SCRIPT",(allocator<char> *)&destination);
      cVar3 = cmGeneratorTarget::GetProperty(pcVar1,(string *)&g);
      std::__cxx11::string::~string((string *)&g);
      if (cVar3.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&local_168,(string *)cVar3.Value);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&destination,"",(allocator<char> *)&stack0xfffffffffffffe07);
        local_1b8._0_8_ = (pointer)0x0;
        local_1b8._8_8_ = 0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1b8);
        backtrace_00.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = in_stack_fffffffffffffe00._M_pi;
        backtrace_00.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_1b8;
        cmInstallScriptGenerator::cmInstallScriptGenerator
                  (&g,&local_168,false,&destination,false,false,backtrace_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
        std::__cxx11::string::~string((string *)&destination);
        std::__cxx11::string::~string((string *)&local_168);
        cmScriptGenerator::Generate((cmScriptGenerator *)&g,os,config,configurationTypes);
        cmInstallScriptGenerator::~cmInstallScriptGenerator(&g);
      }
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void cmLocalGenerator::GenerateTargetInstallRules(
  std::ostream& os, const std::string& config,
  std::vector<std::string> const& configurationTypes)
{
  // Convert the old-style install specification from each target to
  // an install generator and run it.
  const auto& tgts = this->GetGeneratorTargets();
  for (const auto& l : tgts) {
    if (l->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    // Include the user-specified pre-install script for this target.
    if (cmValue preinstall = l->GetProperty("PRE_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(*preinstall, false, "", false, false);
      g.Generate(os, config, configurationTypes);
    }

    // Install this target if a destination is given.
    if (!l->Target->GetInstallPath().empty()) {
      // Compute the full install destination.  Note that converting
      // to unix slashes also removes any trailing slash.
      // We also skip over the leading slash given by the user.
      std::string destination = l->Target->GetInstallPath().substr(1);
      cmSystemTools::ConvertToUnixSlashes(destination);
      if (destination.empty()) {
        destination = ".";
      }

      // Generate the proper install generator for this target type.
      switch (l->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY: {
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(), destination,
                                          false);
          g.Generate(os, config, configurationTypes);
        } break;
        case cmStateEnums::SHARED_LIBRARY: {
#if defined(_WIN32) || defined(__CYGWIN__)
          // Special code to handle DLL.  Install the import library
          // to the normal destination and the DLL to the runtime
          // destination.
          cmInstallTargetGeneratorLocal g1(this, l->GetName(), destination,
                                           true);
          g1.Generate(os, config, configurationTypes);
          // We also skip over the leading slash given by the user.
          destination = l->Target->GetRuntimeInstallPath().substr(1);
          cmSystemTools::ConvertToUnixSlashes(destination);
          cmInstallTargetGeneratorLocal g2(this, l->GetName(), destination,
                                           false);
          g2.Generate(os, config, configurationTypes);
#else
          // Use a target install generator.
          cmInstallTargetGeneratorLocal g(this, l->GetName(), destination,
                                          false);
          g.Generate(os, config, configurationTypes);
#endif
        } break;
        default:
          break;
      }
    }

    // Include the user-specified post-install script for this target.
    if (cmValue postinstall = l->GetProperty("POST_INSTALL_SCRIPT")) {
      cmInstallScriptGenerator g(*postinstall, false, "", false, false);
      g.Generate(os, config, configurationTypes);
    }
  }
}